

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

void __thiscall
Test::Suite::testFailed
          (Suite *this,char *fileName,uint32_t lineNumber,string *errorMessage,string *userMessage)

{
  AssertionFailedException *this_00;
  Assertion AStack_d8;
  
  Assertion::Assertion(&AStack_d8,fileName,lineNumber,errorMessage,userMessage);
  testFailed(this,&AStack_d8);
  Assertion::~Assertion(&AStack_d8);
  if (this->continueAfterFail != false) {
    return;
  }
  this_00 = (AssertionFailedException *)__cxa_allocate_exception(0x10);
  AssertionFailedException::AssertionFailedException(this_00);
  __cxa_throw(this_00,&AssertionFailedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Suite::testFailed(
    const char *fileName, uint32_t lineNumber, std::string &&errorMessage, const std::string &userMessage) {
  testFailed(Assertion(fileName, lineNumber, errorMessage, userMessage));
  if (!continueAfterFailure())
    throw AssertionFailedException{};
}